

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fillpoints.cc
# Opt level: O0

void re2c::scc(dfa_t *dfa,
              stack<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>
              *stack,vector<unsigned_long,_std::allocator<unsigned_long>_> *lowlink,
              vector<bool,_std::allocator<bool>_> *trivial,size_t i)

{
  ulong uVar1;
  value_type vVar2;
  size_type __n;
  size_t sVar3;
  bool bVar4;
  size_t *psVar5;
  reference pvVar6;
  const_reference ppdVar7;
  reference pvVar8;
  byte local_81;
  size_t j_1;
  size_t local_50;
  size_t j;
  size_t c;
  size_t *arcs;
  size_t link;
  size_t i_local;
  vector<bool,_std::allocator<bool>_> *trivial_local;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *lowlink_local;
  stack<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_> *stack_local;
  dfa_t *dfa_local;
  
  link = i;
  i_local = (size_t)trivial;
  trivial_local = (vector<bool,_std::allocator<bool>_> *)lowlink;
  lowlink_local = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)stack;
  stack_local = (stack<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_> *)
                dfa;
  psVar5 = (size_t *)
           std::stack<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>::
           size(stack);
  arcs = psVar5;
  pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)trivial_local,link);
  *pvVar6 = (value_type)psVar5;
  std::stack<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>::push
            ((stack<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_> *)
             lowlink_local,&link);
  ppdVar7 = std::vector<re2c::dfa_state_t_*,_std::allocator<re2c::dfa_state_t_*>_>::operator[]
                      ((vector<re2c::dfa_state_t_*,_std::allocator<re2c::dfa_state_t_*>_> *)
                       stack_local,link);
  c = (size_t)(*ppdVar7)->arcs;
  for (j = 0; j < (stack_local->c).super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Deque_impl_data._M_start._M_first; j = j + 1) {
    local_50 = *(size_type *)(c + j * 8);
    if (local_50 != 0xffffffffffffffff) {
      pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)trivial_local,
                          local_50);
      if (*pvVar6 == 0xfffffffffffffffe) {
        scc((dfa_t *)stack_local,
            (stack<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_> *)
            lowlink_local,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)trivial_local,
            (vector<bool,_std::allocator<bool>_> *)i_local,local_50);
      }
      pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)trivial_local,
                          local_50);
      uVar1 = *pvVar6;
      pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)trivial_local,
                          link);
      if (uVar1 < *pvVar6) {
        pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)trivial_local,
                            local_50);
        vVar2 = *pvVar6;
        pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)trivial_local,
                            link);
        *pvVar6 = vVar2;
      }
    }
  }
  pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)trivial_local,link);
  sVar3 = link;
  if ((size_t *)*pvVar6 == arcs) {
    pvVar8 = std::stack<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>::
             top((stack<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_> *
                 )lowlink_local);
    local_81 = 0;
    if (sVar3 == *pvVar8) {
      bVar4 = loopback(link,(size_t)(stack_local->c).
                                    super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Deque_impl_data._M_start._M_first,(size_t *)c);
      local_81 = bVar4 ^ 0xff;
    }
    _j_1 = std::vector<bool,_std::allocator<bool>_>::operator[]
                     ((vector<bool,_std::allocator<bool>_> *)i_local,link);
    std::_Bit_reference::operator=((_Bit_reference *)&j_1,(bool)(local_81 & 1));
    do {
      pvVar8 = std::stack<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>
               ::top((stack<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>
                      *)lowlink_local);
      __n = *pvVar8;
      std::stack<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>::pop
                ((stack<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_> *
                 )lowlink_local);
      pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)trivial_local,__n
                         );
      *pvVar6 = 0xffffffffffffffff;
    } while (__n != link);
  }
  return;
}

Assistant:

static void scc(
	const dfa_t &dfa,
	std::stack<size_t> &stack,
	std::vector<size_t> &lowlink,
	std::vector<bool> &trivial,
	size_t i)
{
	const size_t link = stack.size();
	lowlink[i] = link;
	stack.push(i);

	const size_t *arcs = dfa.states[i]->arcs;
	for (size_t c = 0; c < dfa.nchars; ++c)
	{
		const size_t j = arcs[c];
		if (j != dfa_t::NIL)
		{
			if (lowlink[j] == UNDEFINED)
			{
				scc(dfa, stack, lowlink, trivial, j);
			}
			if (lowlink[j] < lowlink[i])
			{
				lowlink[i] = lowlink[j];
			}
		}
	}

	if (lowlink[i] == link)
	{
		// SCC is non-trivial (has loops) iff it either:
		//   - consists of multiple nodes (they all must be interconnected)
		//   - consists of single node which loops back to itself
		trivial[i] = i == stack.top()
			&& !loopback(i, dfa.nchars, arcs);

		size_t j;
		do
		{
			j = stack.top();
			stack.pop();
			lowlink[j] = INFINITI;
		}
		while (j != i);
	}
}